

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O2

CClient * __thiscall CManageClient::FindClient(CManageClient *this,int flag)

{
  pointer ppCVar1;
  ulong uVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    ppCVar1 = (this->m_Clients).super__Vector_base<CClient_*,_std::allocator<CClient_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Clients).super__Vector_base<CClient_*,_std::allocator<CClient_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4) {
      return (CClient *)0x0;
    }
    bVar3 = CClient::IsMe(ppCVar1[uVar4],flag);
    uVar2 = uVar4 + 1;
  } while (!bVar3);
  return (this->m_Clients).super__Vector_base<CClient_*,_std::allocator<CClient_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4];
}

Assistant:

CClient* CManageClient::FindClient(const int flag) const{
    for(int i = 0;i < m_Clients.size();i++){
        if(m_Clients[i]->IsMe(flag))
            return m_Clients[i];
    }
    return NULL;
}